

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O0

QString * __thiscall
QXcbScreen::getOutputName(QXcbScreen *this,xcb_randr_get_output_info_reply_t *outputInfo)

{
  long lVar1;
  QString *other;
  char *in_RDX;
  QXcbScreen *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *name;
  QString *in_stack_ffffffffffffff88;
  QString *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this_00 = in_RDI;
  QString::QString((QString *)0x1ccc86);
  if (in_RDX == (char *)0x0) {
    defaultName(in_RSI);
    QString::operator=(this_00,in_stack_ffffffffffffff88);
    QString::~QString((QString *)0x1cccfa);
  }
  else {
    other = (QString *)xcb_randr_get_output_info_name(in_RDX);
    xcb_randr_get_output_info_name_length(in_RDX);
    QString::fromUtf8(in_RDX,CONCAT17(uVar2,in_stack_ffffffffffffffa8));
    QString::operator=(this_00,other);
    QString::~QString((QString *)0x1cccd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QXcbScreen::getOutputName(xcb_randr_get_output_info_reply_t *outputInfo)
{
    QString name;
    if (outputInfo) {
        name = QString::fromUtf8((const char*)xcb_randr_get_output_info_name(outputInfo),
                                 xcb_randr_get_output_info_name_length(outputInfo));
    } else {
        name = defaultName();
    }
    return name;
}